

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O0

bool __thiscall
duckdb::StringStatisticsState::TryTruncateMax
          (StringStatisticsState *this,string_t str,idx_t max_size,string *result)

{
  string_t str_00;
  string_t str_01;
  long in_RDI;
  data_t in_stack_00000017;
  string *in_stack_00000018;
  idx_t in_stack_00000020;
  undefined1 local_1;
  
  if (*(char *)(in_RDI + 8) == '\x1a') {
    str_00.value.pointer.ptr = (char *)this;
    str_00.value._0_8_ = max_size;
    local_1 = TryTruncateMax((StringStatisticsState *)result,str_00,in_stack_00000020,
                             in_stack_00000018,in_stack_00000017);
  }
  else {
    str_01.value.pointer.ptr = (char *)this;
    str_01.value._0_8_ = max_size;
    local_1 = TryTruncateMax((StringStatisticsState *)result,str_01,in_stack_00000020,
                             in_stack_00000018,in_stack_00000017);
  }
  return local_1;
}

Assistant:

bool TryTruncateMax(string_t str, idx_t max_size, string &result) {
		// truncate a string for the max value
		// since 'XXX' < 'XXXX', we need to "increment" a byte to get a correct max value
		// i.e. we need to generate 'XXY' as a string
		// note that this is not necessarily always possible
		D_ASSERT(str.GetSize() > max_size);
		if (type == LogicalTypeId::BLOB) {
			// for blobs we can always increment bytes - we just can't increment past the max of a single byte (2^8)
			return TryTruncateMax(str, max_size, result, static_cast<data_t>(0xFF));
		}
		D_ASSERT(type == LogicalTypeId::VARCHAR);
		// for varchar the situation is more complex - we need to truncate to a valid UTF8 string and increment
		// for now we only increment ASCII characters (characters below 0x7F)
		return TryTruncateMax(str, max_size, result, static_cast<data_t>(0x7F));
	}